

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# misc_tests.c
# Opt level: O1

void cjson_detach_item_via_pointer_should_detach_items(void)

{
  undefined8 ***pppuVar1;
  undefined8 **ppuVar2;
  undefined8 ***pppuVar3;
  undefined8 ***pppuVar4;
  long in_FS_OFFSET;
  cJSON list [4];
  undefined8 **local_128;
  undefined8 **ppuStack_120;
  undefined8 *local_e8;
  undefined8 uStack_e0;
  undefined8 **local_a8;
  undefined8 **ppuStack_a0;
  undefined8 **local_68;
  undefined8 **ppuStack_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_128,0,0x100);
  ppuStack_a0 = &local_e8;
  pppuVar1 = &local_a8;
  pppuVar4 = &local_68;
  pppuVar3 = pppuVar1;
  if (pppuVar1 == (undefined8 ***)0x0) {
    pppuVar3 = &local_128;
  }
  ppuStack_120 = pppuVar4;
  local_a8 = pppuVar4;
  pppuVar3[1] = &local_128;
  uStack_e0 = 0;
  local_e8 = (undefined8 **)0x0;
  local_128 = pppuVar1;
  ppuStack_60 = pppuVar1;
  if ((undefined8 ***)ppuStack_a0 != &local_128) {
    UnityFail(" Expected TRUE Was FALSE",0x109);
  }
  ppuVar2 = local_128;
  if ((undefined8 ***)local_128 != (undefined8 ***)0x0) {
    local_128[1] = ppuStack_120;
  }
  ppuStack_120 = (undefined8 **)0x0;
  local_128 = (undefined8 **)0x0;
  if (((undefined8 ***)ppuVar2 != pppuVar1) || ((undefined8 ***)ppuStack_a0 != pppuVar4)) {
    UnityFail("Didn\'t set the new beginning.",0x10e);
  }
  if ((undefined8 ***)ppuVar2 != pppuVar4) {
    *ppuStack_60 = local_68;
  }
  if ((undefined8 ***)local_68 != (undefined8 ***)0x0) {
    local_68[1] = ppuStack_60;
  }
  pppuVar3 = (undefined8 ***)local_68;
  if ((undefined8 ***)ppuVar2 != pppuVar4) {
    pppuVar3 = (undefined8 ***)ppuVar2;
  }
  if ((undefined8 ***)ppuVar2 != pppuVar4 && (undefined8 ***)local_68 == (undefined8 ***)0x0) {
    ppuVar2[1] = ppuStack_60;
    pppuVar3 = (undefined8 ***)ppuVar2;
  }
  ppuStack_60 = (undefined8 **)0x0;
  local_68 = (undefined8 **)0x0;
  if ((pppuVar3 != pppuVar1) || ((undefined8 ***)local_a8 != (undefined8 ***)0x0)) {
    UnityFail("Didn\'t set the new end",0x113);
  }
  if (pppuVar3 != pppuVar1) {
    *ppuStack_a0 = local_a8;
  }
  if ((undefined8 ***)local_a8 != (undefined8 ***)0x0) {
    local_a8[1] = ppuStack_a0;
  }
  pppuVar4 = (undefined8 ***)local_a8;
  if (pppuVar3 != pppuVar1) {
    pppuVar4 = pppuVar3;
  }
  if (pppuVar3 != pppuVar1 && (undefined8 ***)local_a8 == (undefined8 ***)0x0) {
    pppuVar3[1] = ppuStack_a0;
    pppuVar4 = pppuVar3;
  }
  ppuStack_a0 = (undefined8 **)0x0;
  local_a8 = (undefined8 **)0x0;
  if (pppuVar4 != (undefined8 ***)0x0) {
    UnityFail("Child of the parent wasn\'t set to NULL.",0x118);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void cjson_detach_item_via_pointer_should_detach_items(void)
{
    cJSON list[4];
    cJSON parent[1];

    memset(list, '\0', sizeof(list));

    /* link the list */
    list[0].next = &(list[1]);
    list[1].next = &(list[2]);
    list[2].next = &(list[3]);

    list[3].prev = &(list[2]);
    list[2].prev = &(list[1]);
    list[1].prev = &(list[0]);
    list[0].prev = &(list[3]);

    parent->child = &list[0];

    /* detach in the middle (list[1]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[1])) == &(list[1]), "Failed to detach in the middle.");
    TEST_ASSERT_TRUE_MESSAGE((list[1].prev == NULL) && (list[1].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE((list[0].next == &(list[2])) && (list[2].prev == &(list[0])));

    /* detach beginning (list[0]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[0])) == &(list[0]), "Failed to detach beginning.");
    TEST_ASSERT_TRUE_MESSAGE((list[0].prev == NULL) && (list[0].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].prev == &(list[3])) && (parent->child == &(list[2])), "Didn't set the new beginning.");

    /* detach end (list[3])*/
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &(list[3])) == &(list[3]), "Failed to detach end.");
    TEST_ASSERT_TRUE_MESSAGE((list[3].prev == NULL) && (list[3].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].next == NULL) && (parent->child == &(list[2])), "Didn't set the new end");

    /* detach single item (list[2]) */
    TEST_ASSERT_TRUE_MESSAGE(cJSON_DetachItemViaPointer(parent, &list[2]) == &list[2], "Failed to detach single item.");
    TEST_ASSERT_TRUE_MESSAGE((list[2].prev == NULL) && (list[2].next == NULL), "Didn't set pointers of detached item to NULL.");
    TEST_ASSERT_NULL_MESSAGE(parent->child, "Child of the parent wasn't set to NULL.");
}